

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_verify.cpp
# Opt level: O3

bool IsFinalTx(CTransaction *tx,int nBlockHeight,int64_t nBlockTime)

{
  uint uVar1;
  pointer pCVar2;
  long in_FS_OFFSET;
  bool bVar3;
  
  uVar1 = tx->nLockTime;
  bVar3 = true;
  if ((ulong)uVar1 != 0) {
    if (uVar1 < 500000000) {
      nBlockTime = (long)nBlockHeight;
    }
    if (nBlockTime <= (long)(ulong)uVar1) {
      pCVar2 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        if (pCVar2 == (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_finish) break;
        bVar3 = pCVar2->nSequence == 0xffffffff;
        pCVar2 = pCVar2 + 1;
      } while (bVar3);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool IsFinalTx(const CTransaction &tx, int nBlockHeight, int64_t nBlockTime)
{
    if (tx.nLockTime == 0)
        return true;
    if ((int64_t)tx.nLockTime < ((int64_t)tx.nLockTime < LOCKTIME_THRESHOLD ? (int64_t)nBlockHeight : nBlockTime))
        return true;

    // Even if tx.nLockTime isn't satisfied by nBlockHeight/nBlockTime, a
    // transaction is still considered final if all inputs' nSequence ==
    // SEQUENCE_FINAL (0xffffffff), in which case nLockTime is ignored.
    //
    // Because of this behavior OP_CHECKLOCKTIMEVERIFY/CheckLockTime() will
    // also check that the spending input's nSequence != SEQUENCE_FINAL,
    // ensuring that an unsatisfied nLockTime value will actually cause
    // IsFinalTx() to return false here:
    for (const auto& txin : tx.vin) {
        if (!(txin.nSequence == CTxIn::SEQUENCE_FINAL))
            return false;
    }
    return true;
}